

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageChannel.cpp
# Opt level: O0

Slice * __thiscall
Imf_3_4::TypedFlatImageChannel<unsigned_int>::slice(TypedFlatImageChannel<unsigned_int> *this)

{
  ImageLevel *pIVar1;
  PixelType PVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ImageChannel *in_RSI;
  Slice *in_RDI;
  
  PVar2 = (**in_RSI->_vptr_ImageChannel)();
  pIVar1 = in_RSI[1]._level;
  iVar3 = ImageChannel::pixelsPerRow(in_RSI);
  iVar4 = ImageChannel::xSampling(in_RSI);
  iVar5 = ImageChannel::ySampling(in_RSI);
  Imf_3_4::Slice::Slice(in_RDI,PVar2,(char *)pIVar1,4,(long)iVar3 << 2,iVar4,iVar5,0.0,false,false);
  return in_RDI;
}

Assistant:

Slice
TypedFlatImageChannel<T>::slice () const
{
    return Slice (
        pixelType (),                 // type
        (char*) _base,                // base
        sizeof (T),                   // xStride
        pixelsPerRow () * sizeof (T), // yStride
        xSampling (),
        ySampling ());
}